

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O3

void Server::process_body(single_connection *conn)

{
  int iVar1;
  _Alloc_hider _Var2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char local_c8 [32];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_88;
  char *local_60;
  single_connection *local_58;
  undefined1 local_50 [8];
  string key_str;
  
  puts("------ REQUEST BODY PARSING START ------ ");
  conn->state = 0x10;
  if (conn->query_start_index == conn->query_end_index) {
    pcVar7 = "[WARN] HTTP request content is empty ";
  }
  else {
    iVar3 = strcmp(conn->method,"GET");
    if (iVar3 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&post_list_abi_cxx11_,
                        post_list_abi_cxx11_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      local_50 = (undefined1  [8])&key_str._M_string_length;
      key_str._M_dataplus._M_p = (pointer)0x0;
      key_str._M_string_length._0_1_ = 0;
      pcVar7 = conn->querybuf;
      iVar3 = conn->data_len;
      iVar1 = conn->query_start_index;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c8[8] = '\0';
      local_c8[9] = '\0';
      local_c8[10] = '\0';
      local_c8[0xb] = '\0';
      local_c8[0xc] = '\0';
      local_c8[0xd] = '\0';
      local_c8[0xe] = '\0';
      local_c8[0xf] = '\0';
      local_c8[0x10] = '\0';
      local_c8[0x11] = '\0';
      local_c8[0x12] = '\0';
      local_c8[0x13] = '\0';
      local_c8[0x14] = '\0';
      local_c8[0x15] = '\0';
      local_c8[0x16] = '\0';
      local_c8[0x17] = '\0';
      local_c8[0x18] = '\0';
      local_c8[0x19] = '\0';
      local_c8[0x1a] = '\0';
      local_c8[0x1b] = '\0';
      local_c8[0x1c] = '\0';
      local_c8[0x1d] = '\0';
      local_c8[0x1e] = '\0';
      local_c8[0x1f] = '\0';
      local_58 = conn;
      pcVar5 = strchr(pcVar7 + (long)iVar1 + 1,0x3d);
      conn = local_58;
      if (pcVar5 != (char *)0x0) {
        pcVar8 = pcVar7 + iVar3;
        pcVar7 = pcVar7 + iVar1;
        local_60 = pcVar8;
        do {
          if (pcVar8 == pcVar5 || (long)pcVar8 - (long)pcVar5 < 0) break;
          pcVar7 = strchr(pcVar7 + 1,0x26);
          strncpy((char *)&local_a8,pcVar5 + 1,(long)(int)(~(uint)pcVar5 + (int)pcVar7));
          _Var2 = key_str._M_dataplus;
          strlen((char *)&local_a8);
          std::__cxx11::string::_M_replace((ulong)local_50,0,_Var2._M_p,(ulong)&local_a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&post_list_abi_cxx11_,(value_type *)local_50);
          pcVar5 = strchr(pcVar5 + 1,0x3d);
          pcVar6 = strchr(pcVar7 + 1,0x26);
          pcVar8 = local_60;
          pcVar7 = pcVar6;
          if (local_60 == pcVar6 || (long)local_60 - (long)pcVar6 < 0) {
            pcVar7 = local_60;
          }
          if (pcVar6 == (char *)0x0) {
            pcVar7 = local_60;
          }
          strncpy(local_c8,pcVar5 + 1,(long)(int)(~(uint)pcVar5 + (int)pcVar7));
          uVar4 = atoi(local_c8);
          printf("[INFO] Insert into the map: key = %s, value = %d \n",&local_a8,(ulong)uVar4);
          local_88.first._M_dataplus._M_p = (pointer)&local_88.first.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,local_50,key_str._M_dataplus._M_p + (long)local_50);
          local_88.second = uVar4;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&data_map_abi_cxx11_,&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.first._M_dataplus._M_p != &local_88.first.field_2) {
            operator_delete(local_88.first._M_dataplus._M_p,
                            local_88.first.field_2._M_allocated_capacity + 1);
          }
          local_a8 = 0;
          uStack_a0 = 0;
          local_98 = 0;
          uStack_90 = 0;
          local_c8[0] = '\0';
          local_c8[1] = '\0';
          local_c8[2] = '\0';
          local_c8[3] = '\0';
          local_c8[4] = '\0';
          local_c8[5] = '\0';
          local_c8[6] = '\0';
          local_c8[7] = '\0';
          local_c8[8] = '\0';
          local_c8[9] = '\0';
          local_c8[10] = '\0';
          local_c8[0xb] = '\0';
          local_c8[0xc] = '\0';
          local_c8[0xd] = '\0';
          local_c8[0xe] = '\0';
          local_c8[0xf] = '\0';
          local_c8[0x10] = '\0';
          local_c8[0x11] = '\0';
          local_c8[0x12] = '\0';
          local_c8[0x13] = '\0';
          local_c8[0x14] = '\0';
          local_c8[0x15] = '\0';
          local_c8[0x16] = '\0';
          local_c8[0x17] = '\0';
          local_c8[0x18] = '\0';
          local_c8[0x19] = '\0';
          local_c8[0x1a] = '\0';
          local_c8[0x1b] = '\0';
          local_c8[0x1c] = '\0';
          local_c8[0x1d] = '\0';
          local_c8[0x1e] = '\0';
          local_c8[0x1f] = '\0';
          pcVar5 = strchr(pcVar5 + 1,0x3d);
        } while (pcVar5 != (char *)0x0);
        conn = local_58;
        if (local_50 != (undefined1  [8])&key_str._M_string_length) {
          operator_delete((void *)local_50,
                          CONCAT71(key_str._M_string_length._1_7_,
                                   (undefined1)key_str._M_string_length) + 1);
          conn = local_58;
        }
      }
      goto LAB_00104ab9;
    }
    pcVar7 = "[WARN] Skip parsing HTTP request content ";
  }
  puts(pcVar7);
LAB_00104ab9:
  conn->state = 0x20;
  conn->query_start_index = 0;
  conn->query_end_index = 0;
  conn->write_event->handler = send_response;
  conn->read_event->handler = empty_event_handler;
  Epoll_Event_Op::epoll_mod_event(conn,0xc);
  puts("------ REQUEST BODY PARSING END ------ ");
  return;
}

Assistant:

void Server::process_body(single_connection *conn)
{
    printf("------ REQUEST BODY PARSING START ------ \n");

    /* 更新连接状态为QUERY_BODY */
    conn->state = QUERY_BODY;

    /* 判断可选消息体是否为空 */
    if (conn->query_start_index == conn->query_end_index)
    {
        printf("[WARN] HTTP request content is empty \n");
    }
    else
    {
        /* 请求方法若为GET则忽略请求体 */
        if (strcmp(conn->method, "GET") == 0)
        {
            printf("[WARN] Skip parsing HTTP request content \n");
        }
        /* 请求方法若为POST则需要解析请求体 */
        else
        {
            /* 清空post_list */
            post_list.clear();
            /* key */
            string key_str;
            char key[32];
            /* value */
            int value_int;
            char value[32];
            /* 键或值的长度 */
            int len;
            /* 可选消息体的末尾地址 */
            char *ptr = conn->querybuf + conn->data_len;
            /* find_equ定位“=”的位置 */
            char *find_equ = conn->querybuf + conn->query_start_index;
            /* find_and定位“&”的位置 */
            char *find_and = conn->querybuf + conn->query_start_index;
            while (true)
            {
                memset(key, '\0', sizeof(key));
                memset(value, '\0', sizeof(value));
                /* 定位“=”的位置 */
                find_equ = strpbrk(find_equ + 1, "=");
                /* 所找寻的“=”超出该行范围，退出循环 */
                if ((find_equ == NULL) || (ptr - find_equ <= 0))
                {
                    break;
                }
                /* 定位“&”的位置 */
                find_and = strpbrk(find_and + 1, "&");
                /* 键的长度 */
                len = find_and - find_equ - 1;
                /* 拷贝key值到key字符数组 */
                strncpy(key, find_equ + 1, len);
                key_str = key;
                /* 将键放入post_list以进行后续输出 */
                post_list.push_back(key_str);
                /* 定位“=”的位置 */
                find_equ = strpbrk(find_equ + 1, "=");
                /* 定位“&”的位置 */
                find_and = strpbrk(find_and + 1, "&");
                /* 所找寻的“=”超出该行范围，退出循环 */
                if ((find_and == NULL) || (ptr - find_and <= 0))
                {
                    find_and = ptr;
                }
                /* 值的长度 */
                len = find_and - find_equ - 1;
                /* 拷贝value值到value字符数组 */
                strncpy(value, find_equ + 1, len);
                /* value由字符数组转换为整形 */
                value_int = atoi(value);

                printf("[INFO] Insert into the map: key = %s, value = %d \n", key, value_int);

                /* 向map中插入键值对 */
                data_map.insert(make_pair(key_str, value_int));
            }
        }
    }

    /* 修改该连接状态为SEND_DATA */
    conn->state = SEND_DATA;
    /* 重置起始偏移量以及末尾指针 */
    conn->query_start_index = conn->query_end_index = 0;
    /* 设置该连接写事件回调函数为send_response */
    conn->write_event->handler = send_response;
    /* 设置该连接读事件回调函数为空 */
    conn->read_event->handler = empty_event_handler;
    /* 修改epoll事件为EPOLLOUT */
    Epoll_Event_Op::epoll_mod_event(conn, EPOLLOUT | EPOLLERR);

    printf("------ REQUEST BODY PARSING END ------ \n");
}